

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.cc
# Opt level: O1

bool trng::operator==(mt19937_64 *R1,mt19937_64 *R2)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((R1->S).mt[0] != (R2->S).mt[0]) {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x137) break;
    uVar1 = uVar2 + 1;
  } while ((R1->S).mt[uVar2 + 1] == (R2->S).mt[uVar2 + 1]);
  return 0x136 < uVar2;
}

Assistant:

bool operator==(const mt19937_64::status_type &S1, const mt19937_64::status_type &S2) {
    for (int i{0}; i < mt19937_64::status_type::N; ++i)
      if (S1.mt[i] != S2.mt[i])
        return false;
    return true;
  }